

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

int lzham::lzham_lib_z_inflateInit2(lzham_z_streamp pStream,int window_bits)

{
  int iVar1;
  lzham_z_internal_state *plVar2;
  uint uVar3;
  lzham_uint32 lVar4;
  lzham_decompress_params params;
  lzham_decompress_params local_30;
  
  if (pStream == (lzham_z_streamp)0x0) {
    iVar1 = -2;
  }
  else {
    uVar3 = -window_bits;
    if (0 < window_bits) {
      uVar3 = window_bits;
    }
    iVar1 = -10000;
    if (uVar3 < 0x1e) {
      lVar4 = 0xf;
      if (window_bits < 0) {
        lVar4 = 0xfffffff1;
      }
      if (0xe < uVar3) {
        lVar4 = window_bits;
      }
      local_30.m_num_seed_bytes = 0;
      local_30._20_4_ = 0;
      local_30.m_pSeed_bytes = (void *)0x0;
      local_30.m_table_max_update_interval = 0;
      local_30.m_table_update_interval_slow_rate = 0;
      local_30.m_struct_size = 0x28;
      local_30.m_dict_size_log2 = -lVar4;
      if (0 < (int)lVar4) {
        local_30.m_dict_size_log2 = lVar4;
      }
      local_30._8_8_ = (ulong)((uint)(0 < (int)lVar4) * 4 + 2) << 0x20;
      plVar2 = (lzham_z_internal_state *)lzham_lib_decompress_init(&local_30);
      if (plVar2 == (lzham_z_internal_state *)0x0) {
        iVar1 = -4;
      }
      else {
        pStream->state = plVar2;
        pStream->data_type = 0;
        pStream->adler = 1;
        iVar1 = 0;
        pStream->total_in = 0;
        pStream->reserved = 0;
        pStream->total_out = 0;
        pStream->msg = (char *)0x0;
      }
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int LZHAM_CDECL lzham_lib_z_inflateInit2(lzham_z_streamp pStream, int window_bits)
   {
      if (!pStream) 
         return LZHAM_Z_STREAM_ERROR;
      
#ifdef LZHAM_Z_API_FORCE_WINDOW_BITS
      window_bits = LZHAM_Z_API_FORCE_WINDOW_BITS;
#endif      

      int max_window_bits = LZHAM_64BIT_POINTERS ? LZHAM_MAX_DICT_SIZE_LOG2_X64 : LZHAM_MAX_DICT_SIZE_LOG2_X86;
      if (labs(window_bits) > max_window_bits)
         return LZHAM_Z_PARAM_ERROR;

      if (labs(window_bits) < LZHAM_MIN_DICT_SIZE_LOG2)
         window_bits = (window_bits < 0) ? -LZHAM_MIN_DICT_SIZE_LOG2 : LZHAM_MIN_DICT_SIZE_LOG2;
      
      lzham_decompress_params params;
      utils::zero_object(params);
      params.m_struct_size = sizeof(lzham_decompress_params);
      params.m_dict_size_log2 = static_cast<lzham_uint32>(labs(window_bits));
      
      params.m_decompress_flags = LZHAM_DECOMP_FLAG_COMPUTE_ADLER32;
      if (window_bits > 0)
         params.m_decompress_flags |= LZHAM_DECOMP_FLAG_READ_ZLIB_STREAM;
      
      lzham_decompress_state_ptr pState = lzham_lib_decompress_init(&params);
      if (!pState)
         return LZHAM_Z_MEM_ERROR;
      pStream->state = static_cast<lzham_z_internal_state *>(pState);

      pStream->data_type = 0;
      pStream->adler = LZHAM_Z_ADLER32_INIT;
      pStream->msg = NULL;
      pStream->total_in = 0;
      pStream->total_out = 0;
      pStream->reserved = 0;
            
      return LZHAM_Z_OK;
   }